

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall CMU462::StaticScene::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  double *pdVar1;
  undefined8 *puVar2;
  Vertex *pVVar3;
  _List_node_base *p_Var4;
  undefined1 auVar5 [16];
  double dVar6;
  Size SVar7;
  mapped_type *pmVar8;
  Vector3D *pVVar9;
  bool bVar10;
  long lVar11;
  _List_node_base *p_Var12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int i;
  key_type local_128;
  Vertex *v;
  double dStack_118;
  double local_110;
  vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> verts;
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  vertexLabels;
  HalfedgeMesh _mesh;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_get_primitives_00280a88;
  this_00 = &this->indices;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HalfedgeMesh::HalfedgeMesh(&_mesh,mesh);
  bVar10 = false;
  p_Var12 = (_List_node_base *)&mesh->faces;
  while (p_Var12 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var12->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var12 != (_List_node_base *)&mesh->faces) {
    SVar7 = Face::degree((Face *)(p_Var12 + 1));
    bVar10 = (bool)(bVar10 | SVar7 != 3);
  }
  if (bVar10) {
    HalfedgeMesh::triangulate(&_mesh);
  }
  vertexLabels._M_h._M_buckets = &vertexLabels._M_h._M_single_bucket;
  vertexLabels._M_h._M_bucket_count = 1;
  vertexLabels._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  vertexLabels._M_h._M_element_count = 0;
  vertexLabels._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  verts.super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertexLabels._M_h._M_rehash_policy._M_next_resize = 0;
  vertexLabels._M_h._M_single_bucket = (__node_base_ptr)0x0;
  verts.super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  verts.super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar14 = 0xffffffffffffffe8;
  uVar13 = 0;
  p_Var12 = (_List_node_base *)&_mesh.vertices;
  while (p_Var12 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                    &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var12 != (_List_node_base *)&_mesh.vertices) {
    v = (Vertex *)(p_Var12 + 1);
    std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::push_back
              (&verts,&v);
    pmVar8 = std::__detail::
             _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&vertexLabels,&v);
    *pmVar8 = (mapped_type)uVar13;
    uVar13 = uVar13 + 1;
    uVar14 = uVar14 + 0x18;
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar13;
  uVar15 = 0xffffffffffffffff;
  if (SUB168(auVar5 * ZEXT816(0x18),8) == 0) {
    uVar15 = SUB168(auVar5 * ZEXT816(0x18),0);
  }
  pVVar9 = (Vector3D *)operator_new__(uVar15);
  if (uVar13 != 0) {
    memset(pVVar9,0,(uVar14 - uVar14 % 0x18) + 0x18);
  }
  this->positions = pVVar9;
  pVVar9 = (Vector3D *)operator_new__(uVar15);
  if (uVar13 != 0) {
    memset(pVVar9,0,(uVar14 - uVar14 % 0x18) + 0x18);
  }
  this->normals = pVVar9;
  lVar11 = 0;
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    pVVar3 = verts.
             super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar14];
    pVVar9 = this->positions;
    *(double *)((long)&pVVar9->z + lVar11) = (pVVar3->position).z;
    dVar6 = (pVVar3->position).y;
    pdVar1 = (double *)((long)&pVVar9->x + lVar11);
    *pdVar1 = (pVVar3->position).x;
    pdVar1[1] = dVar6;
    Vertex::normal((Vector3D *)&v,
                   verts.
                   super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14]);
    pVVar9 = this->normals;
    *(double *)((long)&pVVar9->z + lVar11) = local_110;
    puVar2 = (undefined8 *)((long)&pVVar9->x + lVar11);
    *puVar2 = v;
    puVar2[1] = dStack_118;
    lVar11 = lVar11 + 0x18;
  }
  p_Var12 = (_List_node_base *)&_mesh.faces;
  while (p_Var12 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var12->_M_next)->
                   _M_impl)._M_node.super__List_node_base._M_next,
        p_Var12 != (_List_node_base *)&_mesh.faces) {
    p_Var4 = p_Var12[0xb]._M_prev;
    local_128 = (key_type)(*(_List_node_base **)((long)(p_Var4 + 2) + 8) + 1);
    pmVar8 = std::__detail::
             _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&vertexLabels,&local_128);
    v = (Vertex *)(long)*pmVar8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_00,(unsigned_long *)&v);
    local_128 = (key_type)(*(long *)((long)p_Var4[2]._M_next + 0x28) + 0x10);
    pmVar8 = std::__detail::
             _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&vertexLabels,&local_128);
    v = (Vertex *)(long)*pmVar8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_00,(unsigned_long *)&v);
    local_128 = (key_type)(*(long *)(*(long *)((long)p_Var4[2]._M_next + 0x20) + 0x28) + 0x10);
    pmVar8 = std::__detail::
             _Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&vertexLabels,&local_128);
    v = (Vertex *)(long)*pmVar8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (this_00,(unsigned_long *)&v);
  }
  this->bsdf = bsdf;
  std::_Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::~_Vector_base
            (&verts.
              super__Vector_base<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>);
  std::
  _Hashtable<const_CMU462::Vertex_*,_std::pair<const_CMU462::Vertex_*const,_int>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<const_CMU462::Vertex_*>,_std::hash<const_CMU462::Vertex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&vertexLabels._M_h);
  HalfedgeMesh::~HalfedgeMesh(&_mesh);
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {
  // triangulate mesh before sending to visualization or render mode
  HalfedgeMesh _mesh(mesh);

  // Triangulate if needed
  bool triNeeded = false;
  for (auto f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    if(f->degree() != 3) {
      triNeeded = true;
    }
  }
  if(triNeeded) {
    _mesh.triangulate();
  }

  unordered_map<const Vertex*, int> vertexLabels;
  vector<const Vertex*> verts;

  size_t vertexI = 0;
  for (VertexCIter it = _mesh.verticesBegin(); it != _mesh.verticesEnd();
       it++) {
    const Vertex* v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i] = verts[i]->normal();
  }

  for (FaceCIter f = _mesh.facesBegin(); f != _mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;
}